

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym2612.c
# Opt level: O3

void Update_Chan_Algo7_LFO(ym2612_ *YM2612,channel_ *CH,DEV_SMPL **buf,UINT32 length)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  
  if (((CH->SLOT[0].Ecnt == 0x20000000) && (CH->SLOT[2].Ecnt == 0x20000000)) &&
     (CH->SLOT[1].Ecnt == 0x20000000)) {
    if (CH->SLOT[3].Ecnt == 0x20000000 || length == 0) {
      return;
    }
  }
  else if (length == 0) {
    return;
  }
  uVar5 = 0;
  do {
    iVar2 = CH->SLOT[0].Fcnt;
    YM2612->in0 = iVar2;
    iVar4 = CH->SLOT[2].Fcnt;
    YM2612->in1 = iVar4;
    iVar6 = CH->SLOT[1].Fcnt;
    YM2612->in2 = iVar6;
    iVar10 = CH->SLOT[3].Fcnt;
    YM2612->in3 = iVar10;
    uVar7 = YM2612->LFO_FREQ_UP[uVar5] * CH->FMS;
    if (uVar7 < 0x200) {
      iVar2 = iVar2 + CH->SLOT[0].Finc;
      iVar4 = iVar4 + CH->SLOT[2].Finc;
      iVar6 = iVar6 + CH->SLOT[1].Finc;
      iVar9 = CH->SLOT[3].Finc;
    }
    else {
      iVar8 = (int)uVar7 >> 9;
      iVar9 = CH->SLOT[0].Finc;
      iVar1 = CH->SLOT[1].Finc;
      iVar2 = iVar2 + iVar9 + (iVar9 * iVar8 >> 9);
      iVar9 = CH->SLOT[2].Finc;
      iVar4 = iVar4 + iVar9 + (iVar9 * iVar8 >> 9);
      iVar6 = iVar6 + iVar1 + (iVar1 * iVar8 >> 9);
      iVar9 = CH->SLOT[3].Finc;
      iVar9 = (iVar8 * iVar9 >> 9) + iVar9;
    }
    CH->SLOT[0].Fcnt = iVar2;
    CH->SLOT[2].Fcnt = iVar4;
    CH->SLOT[1].Fcnt = iVar6;
    CH->SLOT[3].Fcnt = iVar9 + iVar10;
    iVar2 = YM2612->LFO_ENV_UP[uVar5];
    iVar4 = CH->SLOT[0].Ecnt;
    uVar7 = CH->SLOT[0].TLL + ENV_TAB[iVar4 >> 0x10];
    if ((CH->SLOT[0].SEG & 4) == 0) {
      iVar6 = uVar7 + (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f));
    }
    else {
      iVar6 = 0;
      if ((int)uVar7 < 0x1000) {
        iVar6 = (iVar2 >> ((byte)CH->SLOT[0].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
    }
    YM2612->en0 = iVar6;
    iVar6 = CH->SLOT[2].Ecnt;
    uVar7 = CH->SLOT[2].TLL + ENV_TAB[iVar6 >> 0x10];
    if ((CH->SLOT[2].SEG & 4) == 0) {
      iVar10 = uVar7 + (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f));
    }
    else {
      iVar10 = 0;
      if ((int)uVar7 < 0x1000) {
        iVar10 = (iVar2 >> ((byte)CH->SLOT[2].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
    }
    YM2612->en1 = iVar10;
    uVar7 = CH->SLOT[1].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[1].Ecnt + 2)];
    if ((CH->SLOT[1].SEG & 4) == 0) {
      iVar10 = uVar7 + (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f));
    }
    else {
      iVar10 = 0;
      if ((int)uVar7 < 0x1000) {
        iVar10 = (iVar2 >> ((byte)CH->SLOT[1].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
    }
    YM2612->en2 = iVar10;
    uVar7 = CH->SLOT[3].TLL + ENV_TAB[*(short *)((long)&CH->SLOT[3].Ecnt + 2)];
    if ((CH->SLOT[3].SEG & 4) == 0) {
      iVar10 = uVar7 + (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f));
    }
    else {
      iVar10 = 0;
      if ((int)uVar7 < 0x1000) {
        iVar10 = (iVar2 >> ((byte)CH->SLOT[3].AMS & 0x1f)) + (uVar7 ^ 0xfff);
      }
    }
    YM2612->en3 = iVar10;
    iVar4 = iVar4 + CH->SLOT[0].Einc;
    CH->SLOT[0].Ecnt = iVar4;
    if (CH->SLOT[0].Ecmp <= iVar4) {
      (*ENV_NEXT_EVENT[CH->SLOT[0].Ecurp])(YM2612,CH->SLOT);
      iVar6 = CH->SLOT[2].Ecnt;
    }
    iVar6 = iVar6 + CH->SLOT[2].Einc;
    CH->SLOT[2].Ecnt = iVar6;
    if (CH->SLOT[2].Ecmp <= iVar6) {
      (*ENV_NEXT_EVENT[CH->SLOT[2].Ecurp])(YM2612,CH->SLOT + 2);
    }
    iVar2 = CH->SLOT[1].Ecnt + CH->SLOT[1].Einc;
    CH->SLOT[1].Ecnt = iVar2;
    if (CH->SLOT[1].Ecmp <= iVar2) {
      (*ENV_NEXT_EVENT[CH->SLOT[1].Ecurp])(YM2612,CH->SLOT + 1);
    }
    iVar2 = CH->SLOT[3].Ecnt + CH->SLOT[3].Einc;
    CH->SLOT[3].Ecnt = iVar2;
    if (CH->SLOT[3].Ecmp <= iVar2) {
      (*ENV_NEXT_EVENT[CH->SLOT[3].Ecurp])(YM2612,CH->SLOT + 3);
    }
    YM2612->in0 = YM2612->in0 + (CH->S0_OUT[1] + CH->S0_OUT[0] >> ((byte)CH->FB & 0x1f));
    iVar2 = CH->S0_OUT[0];
    CH->S0_OUT[1] = iVar2;
    CH->S0_OUT[0] =
         *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in0 >> 0xb & 0x7ff8)) +
                 (long)YM2612->en0 * 4);
    uVar3 = iVar2 + *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in3 >> 0xb & 0x7ff8)) +
                            (long)YM2612->en3 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in1 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en1 * 4) +
            *(int *)(*(long *)((long)SIN_TAB + (ulong)((uint)YM2612->in2 >> 0xb & 0x7ff8)) +
                    (long)YM2612->en2 * 4) >> 0xf;
    CH->OUTd = uVar3;
    uVar7 = 0x2fff;
    if ((0x2fff < (int)uVar3) || (uVar7 = 0xffffd001, (int)uVar3 < -0x2fff)) {
      uVar3 = uVar7;
      CH->OUTd = uVar3;
    }
    (*buf)[uVar5] = (*buf)[uVar5] + (uVar3 & CH->LEFT);
    buf[1][uVar5] = buf[1][uVar5] + (CH->RIGHT & CH->OUTd);
    uVar5 = uVar5 + 1;
  } while (length != uVar5);
  return;
}

Assistant:

static void Update_Chan_Algo7_LFO(ym2612_ *YM2612, channel_ *CH, DEV_SMPL **buf, UINT32 length)
{
  UINT32 i;
  int env_LFO, freq_LFO;

  if ((CH->SLOT[S0].Ecnt == ENV_END) && (CH->SLOT[S1].Ecnt == ENV_END) && (CH->SLOT[S2].Ecnt == ENV_END) && (CH->SLOT[S3].Ecnt == ENV_END))
    return;

#if YM_DEBUG_LEVEL > 1
  fprintf(debug_file, "\n\nAlgo 7 LFO len = %d\n\n", length);
#endif

  for (i = 0; i < length; i++)
  {
    GET_CURRENT_PHASE
    UPDATE_PHASE_LFO
    GET_CURRENT_ENV_LFO
    UPDATE_ENV
    DO_ALGO_7
    DO_OUTPUT
  }
}